

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context-defs.cpp
# Opt level: O0

Result<wasm::Ok> * __thiscall
wasm::WATParser::ParseDefsCtx::addData
          (Result<wasm::Ok> *__return_storage_ptr__,ParseDefsCtx *this,undefined8 param_3,
          size_t param_4,Name *mem,uint param_6)

{
  Expression *pEVar1;
  Name *pNVar2;
  bool bVar3;
  Expression **ppEVar4;
  size_type sVar5;
  reference this_00;
  pointer pMVar6;
  ulong pos;
  pointer pDVar7;
  Ok local_9d [20];
  allocator<char> local_89;
  string local_88;
  Err local_68;
  unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_> *local_48;
  value_type *d;
  Name *pNStack_38;
  Index pos_local;
  Name *mem_local;
  ParseDefsCtx *this_local;
  undefined8 local_20;
  Name param_1_local;
  
  d._4_4_ = param_6;
  pNStack_38 = mem;
  mem_local = (Name *)this;
  local_20 = param_3;
  param_1_local.super_IString.str._M_len = param_4;
  param_1_local.super_IString.str._M_str = (char *)__return_storage_ptr__;
  local_48 = std::
             vector<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>,_std::allocator<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>_>_>
             ::operator[](&this->wasm->dataSegments,(ulong)this->index);
  bVar3 = std::optional::operator_cast_to_bool((optional *)&stack0x00000008);
  if (bVar3) {
    pDVar7 = std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>::operator->
                       (local_48);
    pDVar7->isPassive = false;
    ppEVar4 = std::optional<wasm::Expression_*>::operator*
                        ((optional<wasm::Expression_*> *)&stack0x00000008);
    pEVar1 = *ppEVar4;
    pDVar7 = std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>::operator->
                       (local_48);
    pNVar2 = pNStack_38;
    pDVar7->offset = pEVar1;
    if (pNStack_38 == (Name *)0x0) {
      sVar5 = std::
              vector<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
              ::size(&this->wasm->memories);
      if (sVar5 == 0) {
        pos = (ulong)d._4_4_;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_88,"active data segment with no memory",&local_89);
        Lexer::err(&local_68,&this->in,pos,&local_88);
        Result<wasm::Ok>::Result(__return_storage_ptr__,&local_68);
        wasm::Err::~Err(&local_68);
        std::__cxx11::string::~string((string *)&local_88);
        std::allocator<char>::~allocator(&local_89);
        return __return_storage_ptr__;
      }
      this_00 = std::
                vector<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
                ::operator[](&this->wasm->memories,0);
      pMVar6 = std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>::operator->
                         (this_00);
      pDVar7 = std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>::
               operator->(local_48);
      wasm::Name::operator=(&pDVar7->memory,(Name *)pMVar6);
    }
    else {
      pDVar7 = std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>::
               operator->(local_48);
      wasm::Name::operator=(&pDVar7->memory,pNVar2);
    }
  }
  else {
    pDVar7 = std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>::operator->
                       (local_48);
    pDVar7->isPassive = true;
  }
  Result<wasm::Ok>::Result<wasm::Ok>(__return_storage_ptr__,local_9d);
  return __return_storage_ptr__;
}

Assistant:

Result<> ParseDefsCtx::addData(
  Name, Name* mem, std::optional<ExprT> offset, DataStringT, Index pos) {
  auto& d = wasm.dataSegments[index];
  if (offset) {
    d->isPassive = false;
    d->offset = *offset;
    if (mem) {
      d->memory = *mem;
    } else if (wasm.memories.size() > 0) {
      d->memory = wasm.memories[0]->name;
    } else {
      return in.err(pos, "active data segment with no memory");
    }
  } else {
    d->isPassive = true;
  }
  return Ok{};
}